

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O3

Abc_Obj_t * Abc_NtkCreateNodeBuf(Abc_Ntk_t *pNtk,Abc_Obj_t *pFanin)

{
  Abc_Obj_t *pObj;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar1;
  DdNode *n;
  
  if (pNtk->ntkType - ABC_NTK_NETLIST < 2) {
    pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
    if (pFanin != (Abc_Obj_t *)0x0) {
      Abc_ObjAddFanin(pObj,pFanin);
    }
    switch(pNtk->ntkFunc) {
    case ABC_FUNC_SOP:
      pMVar1 = (Mio_Gate_t *)Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,"1 1\n");
      break;
    case ABC_FUNC_BDD:
      n = Cudd_bddIthVar((DdManager *)pNtk->pManFunc,0);
      (pObj->field_5).pData = n;
      Cudd_Ref(n);
      return pObj;
    case ABC_FUNC_AIG:
      pMVar1 = (Mio_Gate_t *)Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,0);
      break;
    case ABC_FUNC_MAP:
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      pMVar1 = Mio_LibraryReadBuf(pLib);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                    ,0x2d2,"Abc_Obj_t *Abc_NtkCreateNodeBuf(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    (pObj->field_5).pData = pMVar1;
    return pObj;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                ,0x2c4,"Abc_Obj_t *Abc_NtkCreateNodeBuf(Abc_Ntk_t *, Abc_Obj_t *)");
}

Assistant:

Abc_Obj_t * Abc_NtkCreateNodeBuf( Abc_Ntk_t * pNtk, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pNode;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk) );
    pNode = Abc_NtkCreateNode( pNtk ); 
    if ( pFanin ) Abc_ObjAddFanin( pNode, pFanin );
    if ( Abc_NtkHasSop(pNtk) )
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, "1 1\n" );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNode->pData = Cudd_bddIthVar((DdManager *)pNtk->pManFunc,0), Cudd_Ref( (DdNode *)pNode->pData );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNode->pData = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,0);
    else if ( Abc_NtkHasMapping(pNtk) )
        pNode->pData = Mio_LibraryReadBuf((Mio_Library_t *)Abc_FrameReadLibGen());
    else
        assert( 0 );
    return pNode;
}